

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Customer.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
AlchoholicCustomer::order
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,AlchoholicCustomer *this,
          vector<Dish,_std::allocator<Dish>_> *menu)

{
  int *__args;
  pointer pDVar1;
  pointer piVar2;
  int iVar3;
  DishType DVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  iterator iVar9;
  ulong uVar10;
  int local_48;
  int local_44;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->minInx != this->maxInx) {
    uVar7 = (int)((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 4) * -0x55555555;
    __args = &this->minInx;
    if (this->ordered == false) {
      if (0 < (int)uVar7) {
        lVar8 = 0;
        uVar10 = 0;
        do {
          pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar6 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                  -0x5555555555555555;
          if (uVar6 < uVar10 || uVar6 - uVar10 == 0) {
LAB_00108af2:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar10);
            goto LAB_00108b03;
          }
          DVar4 = Dish::getType((Dish *)((long)&pDVar1->id + lVar8));
          if (DVar4 == ALC) {
            pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar6 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                    -0x5555555555555555;
            if (uVar6 < uVar10 || uVar6 - uVar10 == 0) goto LAB_00108af2;
            iVar3 = Dish::getPrice((Dish *)((long)&pDVar1->id + lVar8));
            if (iVar3 < this->minAlc) {
              pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar6 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                      -0x5555555555555555;
              if (uVar6 < uVar10 || uVar6 - uVar10 == 0) goto LAB_00108af2;
              iVar3 = Dish::getPrice((Dish *)((long)&pDVar1->id + lVar8));
              this->minAlc = iVar3;
              this->minInx = (int)uVar10;
            }
          }
          pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar6 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                  -0x5555555555555555;
          if (uVar6 < uVar10 || uVar6 - uVar10 == 0) goto LAB_00108af2;
          DVar4 = Dish::getType((Dish *)((long)&pDVar1->id + lVar8));
          if (DVar4 == ALC) {
            pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar6 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                    -0x5555555555555555;
            if (uVar6 < uVar10 || uVar6 - uVar10 == 0) goto LAB_00108af2;
            iVar3 = Dish::getPrice((Dish *)((long)&pDVar1->id + lVar8));
            if (*(int *)&(this->super_Customer).field_0x2c <= iVar3) {
              pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar6 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                      -0x5555555555555555;
              if (uVar6 < uVar10 || uVar6 - uVar10 == 0) goto LAB_00108af2;
              iVar3 = Dish::getPrice((Dish *)((long)&pDVar1->id + lVar8));
              *(int *)&(this->super_Customer).field_0x2c = iVar3;
              this->maxInx = (int)uVar10;
            }
          }
          uVar10 = uVar10 + 1;
          lVar8 = lVar8 + 0x30;
        } while ((uVar7 & 0x7fffffff) != uVar10);
      }
      if (this->minAlc < 0x7f) {
        iVar9._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar9,__args);
        }
        else {
          *iVar9._M_current = *__args;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar9._M_current + 1;
        }
        this->ordered = true;
      }
      else {
        this->ordered = true;
      }
    }
    else {
      if ((int)uVar7 < 1) {
        local_44 = 0x7f;
        local_48 = 0x7f;
      }
      else {
        local_48 = 0x7f;
        lVar8 = 0;
        uVar10 = 0;
        local_44 = 0x7f;
        do {
          pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar6 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                  -0x5555555555555555;
          if (uVar6 < uVar10 || uVar6 - uVar10 == 0) {
LAB_00108b03:
            uVar5 = std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar10);
            piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            if (piVar2 != (pointer)0x0) {
              operator_delete(piVar2);
            }
            _Unwind_Resume(uVar5);
          }
          iVar3 = Dish::getPrice((Dish *)((long)&pDVar1->id + lVar8));
          if (this->minAlc <= iVar3) {
            pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar6 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                    -0x5555555555555555;
            if (uVar6 < uVar10 || uVar6 - uVar10 == 0) goto LAB_00108b03;
            DVar4 = Dish::getType((Dish *)((long)&pDVar1->id + lVar8));
            if (DVar4 == ALC) {
              pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar6 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                      -0x5555555555555555;
              if (uVar6 < uVar10 || uVar6 - uVar10 == 0) goto LAB_00108b03;
              iVar3 = Dish::getPrice((Dish *)((long)&pDVar1->id + lVar8));
              if ((iVar3 == this->minAlc) && ((long)this->minInx < (long)uVar10)) {
                *__args = (int)uVar10;
                pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                uVar6 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                        -0x5555555555555555;
                if (uVar6 < uVar10 || uVar6 - uVar10 == 0) goto LAB_00108b03;
                iVar3 = Dish::getPrice((Dish *)((long)&pDVar1->id + lVar8));
                this->minAlc = iVar3;
                iVar9._M_current =
                     (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                     .super__Vector_impl_data._M_finish;
                if (iVar9._M_current ==
                    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar9,__args)
                  ;
                  return __return_storage_ptr__;
                }
                *iVar9._M_current = *__args;
                goto LAB_00108ad3;
              }
              pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar6 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                      -0x5555555555555555;
              if (uVar6 < uVar10 || uVar6 - uVar10 == 0) goto LAB_00108b03;
              iVar3 = Dish::getPrice((Dish *)((long)&pDVar1->id + lVar8));
              if (this->minAlc < iVar3) {
                pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                uVar6 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                        -0x5555555555555555;
                if (uVar6 < uVar10 || uVar6 - uVar10 == 0) goto LAB_00108b03;
                iVar3 = Dish::getPrice((Dish *)((long)&pDVar1->id + lVar8));
                if (iVar3 < local_48) {
                  pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar6 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                          -0x5555555555555555;
                  if (uVar6 < uVar10 || uVar6 - uVar10 == 0) goto LAB_00108b03;
                  local_48 = Dish::getPrice((Dish *)((long)&pDVar1->id + lVar8));
                  local_44 = (int)uVar10;
                }
              }
            }
          }
          uVar10 = uVar10 + 1;
          lVar8 = lVar8 + 0x30;
        } while ((uVar7 & 0x7fffffff) != uVar10);
      }
      this->minInx = local_44;
      this->minAlc = local_48;
      if (local_44 != 0x7f) {
        iVar9._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar9,__args);
        }
        else {
          *iVar9._M_current = local_44;
LAB_00108ad3:
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar9._M_current + 1;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int>  AlchoholicCustomer::order(const std::vector<Dish> &menu)
{
    int lastChecked = INT8_MAX;
    int lastCheckedIndex = INT8_MAX;
    std::vector<int> newOrder;
    int size = menu.size();
    if(minInx == maxInx)
        return newOrder;
    if(!ordered)
    {
        for (int i = 0; i < size; ++i)
        {
            if (menu.at(static_cast<unsigned long>(i)).getType() == ALC && menu.at(
                    static_cast<unsigned long>(i)).getPrice() < minAlc)
            {
                minAlc = menu.at(static_cast<unsigned long>(i)).getPrice();
                minInx = i;
            }

            if(menu.at(static_cast<unsigned long>(i)).getType() == ALC && menu.at(
                    static_cast<unsigned long>(i)).getPrice() >= maxAlc)
            {
                maxAlc = menu.at(static_cast<unsigned long>(i)).getPrice();
                maxInx = i;
            }
        }

        if(minAlc < INT8_MAX)
        {
            newOrder.push_back(minInx);
            ordered = true;
            return newOrder;
        }
        ordered = true;
        return newOrder;
    }
    for (int i = 0; i < size; ++i)
    {
        if(menu.at(static_cast<unsigned long>(i)).getPrice() >= minAlc && menu.at(
                static_cast<unsigned long>(i)).getType() == ALC)
        {
            if(menu.at(static_cast<unsigned long>(i)).getPrice() == minAlc && minInx < i)// && !changed
            {
                minInx = i;
                minAlc = menu.at(static_cast<unsigned long>(i)).getPrice();
                newOrder.push_back(minInx);
                return newOrder;
            }
            else if(menu.at(static_cast<unsigned long>(i)).getPrice() > minAlc && menu.at(
                    static_cast<unsigned long>(i)).getPrice() < lastChecked)
            {
                lastChecked = menu.at(static_cast<unsigned long>(i)).getPrice();
                lastCheckedIndex = i;
            }
        }
    }
    minInx = lastCheckedIndex;
    minAlc = lastChecked;
    if(minInx != INT8_MAX)
        newOrder.push_back(minInx);
    return newOrder;
}